

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticks_linear.c
# Opt level: O0

void mpt_ticks_linear(mpt_dpoint *pts,size_t nt,double dx,double dy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double y;
  double x;
  size_t i;
  double ty;
  double tx;
  double by;
  double bx;
  double dy_local;
  double dx_local;
  size_t nt_local;
  mpt_dpoint *pts_local;
  undefined4 uVar10;
  
  dVar5 = (double)(nt - 1);
  if (nt != 0) {
    dVar1 = pts->x;
    dVar2 = pts->y;
    dVar3 = pts[1].x;
    dVar4 = pts[1].y;
    uVar10 = (undefined4)((ulong)dVar5 >> 0x20);
    auVar11._8_4_ = uVar10;
    auVar11._0_8_ = dVar5;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = uVar10;
    auVar12._0_8_ = dVar5;
    auVar12._12_4_ = 0x45300000;
    nt_local = (size_t)pts;
    for (x = 4.94065645841247e-324; (ulong)x <= (ulong)dVar5; x = (double)((long)x + 1)) {
      uVar10 = (undefined4)((ulong)x >> 0x20);
      auVar8._8_4_ = uVar10;
      auVar8._0_8_ = x;
      auVar8._12_4_ = 0x45300000;
      dVar6 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(x,0)) - 4503599627370496.0)) *
              (dx / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(dVar5,0)) - 4503599627370496.0)));
      auVar9._8_4_ = uVar10;
      auVar9._0_8_ = x;
      auVar9._12_4_ = 0x45300000;
      dVar7 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(x,0)) - 4503599627370496.0)) *
              (dy / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(dVar5,0)) - 4503599627370496.0)));
      *(double *)nt_local = dVar1 + dVar6;
      *(double *)(nt_local + 8) = dVar2 + dVar7;
      *(double *)(nt_local + 0x10) = dVar3 + dVar6;
      *(double *)(nt_local + 0x18) = dVar4 + dVar7;
      nt_local = nt_local + 0x20;
    }
  }
  return;
}

Assistant:

extern void mpt_ticks_linear(MPT_STRUCT(dpoint) *pts, size_t nt, double dx, double dy)
{
	double bx, by, tx, ty;
	size_t i;
	
	if (!nt--) {
		return;
	}
	/* tick base */
	bx = pts[0].x;
	by = pts[0].y;
	/* tick end */
	tx = pts[1].x;
	ty = pts[1].y;
	
	/* tick difference */
	dx = dx / nt;
	dy = dy / nt;
	
	/* set tick data */
	for (i = 1; i <= nt; i++) {
		double x = i * dx, y = i * dy;
		
		pts[0].x = bx + x;
		pts[0].y = by + y;
		pts[1].x = tx + x;
		pts[1].y = ty + y;
		
		pts += 2;
	}
}